

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp-quicksort.cpp
# Opt level: O3

void strsort(uchar **strings,Lcp *lcps,int lo,int hi)

{
  Lcp LVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int __tmp_1;
  int iVar8;
  uchar *__tmp;
  byte bVar9;
  byte bVar10;
  long lVar11;
  
  if (hi <= lo) {
    return;
  }
  puVar2 = strings[lo];
  iVar7 = lo + 1;
  iVar5 = lo;
  iVar6 = hi;
  do {
    puVar3 = strings[iVar7];
    iVar8 = lcps[iVar7];
    lVar11 = (long)iVar8;
    bVar9 = puVar3[lVar11];
    bVar10 = puVar2[lVar11];
    if (bVar9 == bVar10) {
      do {
        if (bVar10 == 0) break;
        lVar11 = lVar11 + 1;
        iVar8 = iVar8 + 1;
        lcps[iVar7] = iVar8;
        bVar9 = puVar3[lVar11];
        bVar10 = puVar2[lVar11];
      } while (bVar9 == bVar10);
    }
    if (bVar9 < bVar10) {
      puVar4 = strings[iVar5];
      strings[iVar5] = puVar3;
      strings[iVar7] = puVar4;
      LVar1 = lcps[iVar5];
      lcps[iVar5] = iVar8;
      lcps[iVar7] = LVar1;
      iVar7 = iVar7 + 1;
      iVar5 = iVar5 + 1;
    }
    else if (bVar9 == bVar10) {
      iVar7 = iVar7 + 1;
    }
    else {
      strings[iVar7] = strings[iVar6];
      strings[iVar6] = puVar3;
      lcps[iVar7] = lcps[iVar6];
      lcps[iVar6] = iVar8;
      iVar6 = iVar6 + -1;
    }
    if (iVar6 < iVar7) {
      lcpsort<true>(strings,lcps,lo,iVar5 + -1);
      lcpsort<false>(strings,lcps,iVar6 + 1,hi);
      return;
    }
  } while( true );
}

Assistant:

void strsort(unsigned char * strings[], Lcp lcps[], int lo, int hi )
{
  if ( hi <= lo ) return;
  int lt = lo, gt = hi;

  unsigned char  *  pivotStr = strings[lo];
  for( int i = lo + 1; i <= gt; )
    {
      int cmpr = lcpstrcmp( pivotStr, strings[i], lcps[i] );
      if      (cmpr < 0) exch( strings, lcps, lt++, i++);
      else if (cmpr > 0) exch( strings, lcps, i, gt--);
      else            i++;
    }

  lcpsort<true> ( strings, lcps, lo, lt-1 );
  lcpsort<false>( strings, lcps, gt+1, hi );  
}